

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool tdefl_compress_fast(tdefl_compressor *d)

{
  mz_uint8 *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  uint uVar8;
  uint uVar9;
  mz_uint mVar10;
  mz_uint8 *pmVar11;
  byte *pbVar12;
  byte *pbVar13;
  mz_uint8 mVar14;
  mz_uint mVar16;
  mz_uint8 mVar17;
  byte *pbVar19;
  mz_uint mVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  ushort uVar26;
  uint uVar27;
  uint uVar28;
  bool bVar29;
  short sVar15;
  short sVar18;
  
  uVar28 = d->m_lookahead_pos;
  mVar20 = d->m_lookahead_size;
  uVar25 = d->m_dict_size;
  mVar16 = d->m_total_lz_bytes;
  mVar10 = d->m_num_flags_left;
  pbVar13 = d->m_pLZ_code_buf;
  pbVar19 = d->m_pLZ_flags;
  uVar21 = uVar28 & 0x7fff;
  pmVar1 = d->m_dict;
  while ((uVar6 = d->m_src_buf_left, uVar6 != 0 || ((d->m_flush != TDEFL_NO_FLUSH && (mVar20 != 0)))
         )) {
    uVar7 = uVar6 & 0xffffffff;
    if (0x1000 - mVar20 <= uVar6) {
      uVar7 = (ulong)(0x1000 - mVar20);
    }
    d->m_src_buf_left = uVar6 - uVar7;
    iVar5 = (int)uVar7;
    if (iVar5 != 0) {
      uVar23 = uVar28 + mVar20;
      pmVar11 = d->m_pSrc;
      do {
        uVar23 = uVar23 & 0x7fff;
        uVar6 = (ulong)(0x8000 - uVar23);
        if ((uint)uVar7 <= 0x8000 - uVar23) {
          uVar6 = uVar7;
        }
        memcpy(pmVar1 + uVar23,pmVar11,uVar6);
        uVar27 = (uint)uVar6;
        if (uVar23 < 0x101) {
          __n = (ulong)(0x101 - uVar23);
          if (uVar27 < 0x101 - uVar23) {
            __n = uVar6;
          }
          memcpy(d->m_dict + (ulong)uVar23 + 0x8000,d->m_pSrc,__n);
        }
        pmVar11 = d->m_pSrc + uVar6;
        d->m_pSrc = pmVar11;
        uVar23 = uVar23 + uVar27;
        uVar27 = (uint)uVar7 - uVar27;
        uVar7 = (ulong)uVar27;
      } while (uVar27 != 0);
    }
    mVar20 = iVar5 + mVar20;
    uVar23 = 0x8000 - mVar20;
    if (uVar25 <= 0x8000 - mVar20) {
      uVar23 = uVar25;
    }
    uVar25 = uVar23;
    uVar23 = mVar20;
    if ((d->m_flush == TDEFL_NO_FLUSH) && (mVar20 < 0x1000)) break;
    while (3 < uVar23) {
      uVar6 = (ulong)uVar21;
      uVar27 = *(uint *)(d->m_dict + uVar6);
      uVar8 = uVar27 & 0xfff ^ (uVar27 & 0xffffff) >> 0x11;
      uVar4 = d->m_hash[uVar8];
      uVar26 = (ushort)uVar28;
      d->m_hash[uVar8] = uVar26;
      uVar9 = uVar28 - uVar4;
      uVar8 = uVar9 & 0xffff;
      if ((uVar25 < uVar8) ||
         (uVar7 = (ulong)(uVar4 & 0x7fff),
         (*(uint *)(pmVar1 + uVar7) & 0xffffff) != (uVar27 & 0xffffff))) {
        *pbVar13 = (byte)uVar27;
        *pbVar19 = *pbVar19 >> 1;
LAB_0021fbf6:
        uVar6 = (ulong)(uVar27 & 0xff);
        uVar22 = 1;
        pbVar13 = pbVar13 + 1;
      }
      else {
        pmVar11 = d->m_dict + uVar6 + 0x100;
        lVar24 = 0;
        do {
          sVar15 = *(short *)(d->m_dict + lVar24 + uVar6 + 2);
          sVar18 = *(short *)(d->m_dict + lVar24 + uVar7 + 2);
          if (sVar15 != sVar18) {
            pmVar11 = d->m_dict + lVar24 + uVar6 + 2;
LAB_0021fcdd:
            mVar17 = (mz_uint8)sVar18;
            mVar14 = (mz_uint8)sVar15;
            bVar29 = false;
            goto LAB_0021fce0;
          }
          sVar15 = *(short *)(d->m_dict + lVar24 + uVar6 + 4);
          sVar18 = *(short *)(d->m_dict + lVar24 + uVar7 + 4);
          if (sVar15 != sVar18) {
            pmVar11 = d->m_dict + lVar24 + uVar6 + 4;
            goto LAB_0021fcdd;
          }
          sVar15 = *(short *)(d->m_dict + lVar24 + uVar6 + 6);
          sVar18 = *(short *)(d->m_dict + lVar24 + uVar7 + 6);
          if (sVar15 != sVar18) {
            pmVar11 = d->m_dict + lVar24 + uVar6 + 6;
            goto LAB_0021fcdd;
          }
          sVar15 = *(short *)(d->m_dict + lVar24 + uVar6 + 8);
          sVar18 = *(short *)(d->m_dict + lVar24 + uVar7 + 8);
          if (sVar15 != sVar18) {
            pmVar11 = d->m_dict + lVar24 + uVar6 + 8;
            goto LAB_0021fcdd;
          }
          lVar24 = lVar24 + 8;
        } while ((int)lVar24 != 0x100);
        mVar14 = *pmVar11;
        mVar17 = d->m_dict[(ulong)(uVar4 & 0x7fff) + 0x100];
        bVar29 = true;
LAB_0021fce0:
        uVar22 = 0x102;
        if (uVar26 == uVar4) {
          uVar22 = 0;
        }
        if (!bVar29) {
          uVar22 = (uint)(mVar14 == mVar17) | (int)pmVar11 - ((int)pmVar1 + uVar21) & 0xfffffffe;
        }
        if ((uVar22 < 3) || ((0x1fff < uVar8 && (uVar22 == 3)))) {
          *pbVar13 = (byte)uVar27;
          *pbVar19 = *pbVar19 >> 1;
          goto LAB_0021fbf6;
        }
        if ((uVar26 == uVar4) || (0x8000 < (uVar9 & 0xffff))) {
          __assert_fail("(cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                        ,0x5f2,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
        }
        if (uVar23 <= uVar22) {
          uVar22 = uVar23;
        }
        uVar8 = uVar8 - 1;
        *pbVar13 = (byte)(uVar22 - 3);
        *(short *)(pbVar13 + 1) = (short)uVar8;
        pbVar13 = pbVar13 + 3;
        *pbVar19 = *pbVar19 >> 1 | 0x80;
        pbVar12 = "" + (uVar8 >> 8);
        if (uVar8 < 0x200) {
          pbVar12 = "" + (uVar8 & 0x1ff);
        }
        pmVar2 = d->m_huff_count[1] + *pbVar12;
        *pmVar2 = *pmVar2 + 1;
        uVar6 = (ulong)s_tdefl_len_sym[uVar22 - 3];
      }
      pmVar2 = d->m_huff_count[0] + uVar6;
      *pmVar2 = *pmVar2 + 1;
      bVar29 = mVar10 - 1 == 0;
      if (bVar29) {
        pbVar19 = pbVar13;
      }
      mVar10 = mVar10 - 1;
      if (bVar29) {
        mVar10 = 8;
      }
      uVar25 = uVar25 + uVar22;
      if (0x7fff < uVar25) {
        uVar25 = 0x8000;
      }
      if (uVar23 < uVar22) {
        __assert_fail("lookahead_size >= cur_match_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x613,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
      }
      pbVar13 = pbVar13 + bVar29;
      mVar16 = mVar16 + uVar22;
      uVar28 = uVar28 + uVar22;
      if (d->m_lz_code_buf + 0xfff8 < pbVar13) {
        d->m_lookahead_pos = uVar28;
        d->m_lookahead_size = uVar23 - uVar22;
        d->m_dict_size = uVar25;
        d->m_total_lz_bytes = mVar16;
        d->m_pLZ_code_buf = pbVar13;
        d->m_pLZ_flags = pbVar19;
        d->m_num_flags_left = mVar10;
        iVar5 = tdefl_flush_block(d,0);
        if (iVar5 != 0) goto LAB_0021feb6;
        mVar16 = d->m_total_lz_bytes;
        pbVar13 = d->m_pLZ_code_buf;
        pbVar19 = d->m_pLZ_flags;
        mVar10 = d->m_num_flags_left;
      }
      uVar21 = uVar22 + uVar21 & 0x7fff;
      uVar23 = uVar23 - uVar22;
    }
    mVar20 = 0;
    while (uVar23 != 0) {
      uVar23 = uVar23 - 1;
      bVar3 = d->m_dict[uVar21];
      *pbVar13 = bVar3;
      *pbVar19 = *pbVar19 >> 1;
      mVar16 = mVar16 + 1;
      pbVar12 = pbVar13 + 1;
      mVar10 = mVar10 - 1;
      if (mVar10 == 0) {
        mVar10 = 8;
        pbVar19 = pbVar12;
        pbVar12 = pbVar13 + 2;
      }
      pmVar2 = d->m_huff_count[0] + bVar3;
      *pmVar2 = *pmVar2 + 1;
      uVar28 = uVar28 + 1;
      uVar25 = uVar25 + 1;
      if (0x7fff < uVar25) {
        uVar25 = 0x8000;
      }
      if (d->m_lz_code_buf + 0xfff8 < pbVar12) {
        d->m_lookahead_pos = uVar28;
        d->m_lookahead_size = uVar23;
        d->m_dict_size = uVar25;
        d->m_total_lz_bytes = mVar16;
        d->m_pLZ_code_buf = pbVar12;
        d->m_pLZ_flags = pbVar19;
        d->m_num_flags_left = mVar10;
        iVar5 = tdefl_flush_block(d,0);
        if (iVar5 != 0) goto LAB_0021feb6;
        mVar16 = d->m_total_lz_bytes;
        pbVar12 = d->m_pLZ_code_buf;
        pbVar19 = d->m_pLZ_flags;
        mVar10 = d->m_num_flags_left;
      }
      uVar21 = uVar21 + 1 & 0x7fff;
      pbVar13 = pbVar12;
    }
  }
  d->m_lookahead_pos = uVar28;
  d->m_lookahead_size = mVar20;
  d->m_dict_size = uVar25;
  d->m_total_lz_bytes = mVar16;
  d->m_pLZ_code_buf = pbVar13;
  d->m_pLZ_flags = pbVar19;
  d->m_num_flags_left = mVar10;
  bVar29 = true;
LAB_0021feb9:
  return (mz_bool)bVar29;
LAB_0021feb6:
  bVar29 = -1 < iVar5;
  goto LAB_0021feb9;
}

Assistant:

static mz_bool tdefl_compress_fast(tdefl_compressor *d)
{
    /* Faster, minimally featured LZRW1-style match+parse loop with better register utilization. Intended for applications where raw throughput is valued more highly than ratio. */
    mz_uint lookahead_pos = d->m_lookahead_pos, lookahead_size = d->m_lookahead_size, dict_size = d->m_dict_size, total_lz_bytes = d->m_total_lz_bytes, num_flags_left = d->m_num_flags_left;
    mz_uint8 *pLZ_code_buf = d->m_pLZ_code_buf, *pLZ_flags = d->m_pLZ_flags;
    mz_uint cur_pos = lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;

    while ((d->m_src_buf_left) || ((d->m_flush) && (lookahead_size)))
    {
        const mz_uint TDEFL_COMP_FAST_LOOKAHEAD_SIZE = 4096;
        mz_uint dst_pos = (lookahead_pos + lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
        mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(d->m_src_buf_left, TDEFL_COMP_FAST_LOOKAHEAD_SIZE - lookahead_size);
        d->m_src_buf_left -= num_bytes_to_process;
        lookahead_size += num_bytes_to_process;

        while (num_bytes_to_process)
        {
            mz_uint32 n = MZ_MIN(TDEFL_LZ_DICT_SIZE - dst_pos, num_bytes_to_process);
            memcpy(d->m_dict + dst_pos, d->m_pSrc, n);
            if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                memcpy(d->m_dict + TDEFL_LZ_DICT_SIZE + dst_pos, d->m_pSrc, MZ_MIN(n, (TDEFL_MAX_MATCH_LEN - 1) - dst_pos));
            d->m_pSrc += n;
            dst_pos = (dst_pos + n) & TDEFL_LZ_DICT_SIZE_MASK;
            num_bytes_to_process -= n;
        }

        dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - lookahead_size, dict_size);
        if ((!d->m_flush) && (lookahead_size < TDEFL_COMP_FAST_LOOKAHEAD_SIZE))
            break;

        while (lookahead_size >= 4)
        {
            mz_uint cur_match_dist, cur_match_len = 1;
            mz_uint8 *pCur_dict = d->m_dict + cur_pos;
            mz_uint first_trigram = (*(const mz_uint32 *)pCur_dict) & 0xFFFFFF;
            mz_uint hash = (first_trigram ^ (first_trigram >> (24 - (TDEFL_LZ_HASH_BITS - 8)))) & TDEFL_LEVEL1_HASH_SIZE_MASK;
            mz_uint probe_pos = d->m_hash[hash];
            d->m_hash[hash] = (mz_uint16)lookahead_pos;

            if (((cur_match_dist = (mz_uint16)(lookahead_pos - probe_pos)) <= dict_size) && ((*(const mz_uint32 *)(d->m_dict + (probe_pos &= TDEFL_LZ_DICT_SIZE_MASK)) & 0xFFFFFF) == first_trigram))
            {
                const mz_uint16 *p = (const mz_uint16 *)pCur_dict;
                const mz_uint16 *q = (const mz_uint16 *)(d->m_dict + probe_pos);
                mz_uint32 probe_len = 32;
                do
                {
                } while ((TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) &&
                         (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (--probe_len > 0));
                cur_match_len = ((mz_uint)(p - (const mz_uint16 *)pCur_dict) * 2) + (mz_uint)(*(const mz_uint8 *)p == *(const mz_uint8 *)q);
                if (!probe_len)
                    cur_match_len = cur_match_dist ? TDEFL_MAX_MATCH_LEN : 0;

                if ((cur_match_len < TDEFL_MIN_MATCH_LEN) || ((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)))
                {
                    cur_match_len = 1;
                    *pLZ_code_buf++ = (mz_uint8)first_trigram;
                    *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                    d->m_huff_count[0][(mz_uint8)first_trigram]++;
                }
                else
                {
                    mz_uint32 s0, s1;
                    cur_match_len = MZ_MIN(cur_match_len, lookahead_size);

                    MZ_ASSERT((cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE));

                    cur_match_dist--;

                    pLZ_code_buf[0] = (mz_uint8)(cur_match_len - TDEFL_MIN_MATCH_LEN);
                    *(mz_uint16 *)(&pLZ_code_buf[1]) = (mz_uint16)cur_match_dist;
                    pLZ_code_buf += 3;
                    *pLZ_flags = (mz_uint8)((*pLZ_flags >> 1) | 0x80);

                    s0 = s_tdefl_small_dist_sym[cur_match_dist & 511];
                    s1 = s_tdefl_large_dist_sym[cur_match_dist >> 8];
                    d->m_huff_count[1][(cur_match_dist < 512) ? s0 : s1]++;

                    d->m_huff_count[0][s_tdefl_len_sym[cur_match_len - TDEFL_MIN_MATCH_LEN]]++;
                }
            }
            else
            {
                *pLZ_code_buf++ = (mz_uint8)first_trigram;
                *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                d->m_huff_count[0][(mz_uint8)first_trigram]++;
            }

            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            total_lz_bytes += cur_match_len;
            lookahead_pos += cur_match_len;
            dict_size = MZ_MIN(dict_size + cur_match_len, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + cur_match_len) & TDEFL_LZ_DICT_SIZE_MASK;
            MZ_ASSERT(lookahead_size >= cur_match_len);
            lookahead_size -= cur_match_len;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }

        while (lookahead_size)
        {
            mz_uint8 lit = d->m_dict[cur_pos];

            total_lz_bytes++;
            *pLZ_code_buf++ = lit;
            *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            d->m_huff_count[0][lit]++;

            lookahead_pos++;
            dict_size = MZ_MIN(dict_size + 1, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
            lookahead_size--;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }
    }

    d->m_lookahead_pos = lookahead_pos;
    d->m_lookahead_size = lookahead_size;
    d->m_dict_size = dict_size;
    d->m_total_lz_bytes = total_lz_bytes;
    d->m_pLZ_code_buf = pLZ_code_buf;
    d->m_pLZ_flags = pLZ_flags;
    d->m_num_flags_left = num_flags_left;
    return MZ_TRUE;
}